

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCore.c
# Opt level: O3

int Sfm_NodeResubSolve(Sfm_Ntk_t *p,int iNode,int f,int fRemoveOnly)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Wrd_t *pVVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  word *pwVar7;
  word wVar8;
  undefined4 in_register_00000014;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  timespec ts;
  word uTruth;
  uint local_34;
  
  uVar9 = CONCAT44(in_register_00000014,f);
  if ((iNode < p->nPis) || (uVar4 = (ulong)(uint)iNode, p->nObjs <= p->nPos + iNode)) {
    __assert_fail("Sfm_ObjIsNode(p, iNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmCore.c"
                  ,0x75,"int Sfm_NodeResubSolve(Sfm_Ntk_t *, int, int, int)");
  }
  if (-1 < f) {
    if ((-1 < iNode) && (iNode < (p->vFanins).nSize)) {
      pVVar2 = (p->vFanins).pArray;
      uVar14 = pVVar2[uVar4].nSize;
      if ((int)uVar14 <= f) goto LAB_0052a4aa;
      p->nTryRemoves = p->nTryRemoves + 1;
      uVar13 = (ulong)(uint)f;
      if (p->pPars->fVeryVerbose != 0) {
        if ((p->vLevels).nSize <= iNode) {
LAB_0052a44d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar15 = p->vDivs->nSize;
        iVar6 = p->vNodes->nSize;
        local_34 = (p->vLevels).pArray[uVar4];
        uVar16 = pVVar2[uVar4].pArray[uVar13];
        uVar5 = Sfm_ObjMffcSize(p,uVar16);
        printf("%5d : Lev =%3d. Leaf =%3d.  Node =%3d.  Div=%3d.  Fanin =%4d (%d/%d). MFFC = %d\n",
               uVar4,(ulong)local_34,0,iVar6,(ulong)uVar15,(ulong)uVar16,uVar9,(ulong)uVar14,
               (ulong)uVar5);
      }
      p->nCexes = 0;
      pVVar3 = p->vDivCexes;
      uVar14 = p->vDivs->nSize;
      if (pVVar3->nCap < (int)uVar14) {
        if (pVVar3->pArray == (word *)0x0) {
          pwVar7 = (word *)malloc((long)(int)uVar14 << 3);
        }
        else {
          pwVar7 = (word *)realloc(pVVar3->pArray,(long)(int)uVar14 << 3);
        }
        pVVar3->pArray = pwVar7;
        if (pwVar7 == (word *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
        pVVar3->nCap = uVar14;
      }
      if (0 < (int)uVar14) {
        memset(pVVar3->pArray,0,(ulong)uVar14 * 8);
      }
      pVVar3->nSize = uVar14;
      p->vDivIds->nSize = 0;
      iVar6 = (p->vFanins).nSize;
      if (iNode < iVar6) {
        uVar12 = 0;
        uVar14 = 0xffffffff;
        do {
          pVVar2 = (p->vFanins).pArray;
          if ((long)pVVar2[uVar4].nSize <= (long)uVar12) {
            if (uVar14 == 0xffffffff) {
              __assert_fail("iFaninRem != -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmCore.c"
                            ,0x87,"int Sfm_NodeResubSolve(Sfm_Ntk_t *, int, int, int)");
            }
            if (((int)uVar14 < 0) || (p->vFixed->nSize <= (int)uVar14)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            uVar15 = 0xffffffff;
            if (p->vFixed->pArray[uVar14] != '\0') {
              if (iVar6 <= (int)uVar14) break;
              if (pVVar2[uVar14].nSize == 1) {
                uVar15 = *pVVar2[uVar14].pArray;
              }
            }
            iVar6 = clock_gettime(3,(timespec *)&ts);
            if (iVar6 < 0) {
              lVar10 = 1;
            }
            else {
              lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
              lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + ts.tv_sec * -1000000;
            }
            wVar8 = Sfm_ComputeInterpolant(p);
            uTruth = wVar8;
            iVar6 = clock_gettime(3,(timespec *)&ts);
            if (iVar6 < 0) {
              lVar11 = -1;
            }
            else {
              lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            p->timeSat = p->timeSat + lVar11 + lVar10;
            if (wVar8 == 0x8765432187654321) {
              if (fRemoveOnly != 0) {
                return 0;
              }
              if (p->pPars->fRrOnly != 0) {
                return 0;
              }
              if (p->vDivs->nSize == 0) {
                return 0;
              }
              p->nTryResubs = p->nTryResubs + 1;
              iVar6 = p->nCexes;
              goto LAB_0052a153;
            }
            if (wVar8 == 0x1234567812345678) {
              p->nTimeOuts = p->nTimeOuts + 1;
              return 0;
            }
            if (p->pPars->fVeryVerbose == 0) goto LAB_0052a398;
            if (iNode < (p->vFanins).nSize) {
              pVVar2 = (p->vFanins).pArray;
              if (pVVar2[uVar4].nSize <= f) goto LAB_0052a44d;
              printf("Node %d: Fanin %d (%d) can be removed.  ",uVar4,uVar9,
                     (ulong)(uint)pVVar2[uVar4].pArray[uVar13]);
              uVar16 = 0xffffffff;
              goto LAB_0052a350;
            }
            break;
          }
          uVar15 = pVVar2[uVar4].pArray[uVar12];
          if (uVar13 != uVar12) {
            if (((int)uVar15 < 0) || ((p->vId2Var).nSize <= (int)uVar15)) goto LAB_0052a44d;
            iVar6 = (p->vId2Var).pArray[uVar15];
            if (iVar6 < 1) goto LAB_0052a46c;
            Vec_IntPush(p->vDivIds,iVar6);
            iVar6 = (p->vFanins).nSize;
            uVar15 = uVar14;
          }
          uVar12 = uVar12 + 1;
          uVar14 = uVar15;
        } while (iNode < iVar6);
      }
    }
LAB_00529fd7:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
LAB_0052a4aa:
  __assert_fail("f >= 0 && f < Sfm_ObjFaninNum(p, iNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmCore.c"
                ,0x76,"int Sfm_NodeResubSolve(Sfm_Ntk_t *, int, int, int)");
LAB_0052a153:
  uVar14 = p->vDivCexes->nSize;
  uVar12 = 0;
  if (0 < (int)uVar14) {
    uVar12 = 0;
    do {
      if (p->vDivCexes->pArray[uVar12] == 0xffffffffffffffffU >> (-(char)iVar6 & 0x3fU)) {
        if ((long)p->vDivs->nSize <= (long)uVar12) goto LAB_0052a44d;
        if (p->vDivs->pArray[uVar12] != uVar15) goto LAB_0052a1ae;
      }
      uVar12 = uVar12 + 1;
    } while (uVar14 != uVar12);
    uVar12 = (ulong)uVar14;
  }
LAB_0052a1ae:
  uVar14 = p->vDivs->nSize;
  uVar16 = (uint)uVar12;
  if (uVar16 == uVar14) {
    return 0;
  }
  if ((int)uVar14 <= (int)uVar16) goto LAB_0052a44d;
  uVar14 = p->vDivs->pArray[uVar12 & 0xffffffff];
  if (uVar14 == uVar15) {
    __assert_fail("Vec_IntEntry(p->vDivs, iVar) != iFaninSkip",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmCore.c"
                  ,0xb2,"int Sfm_NodeResubSolve(Sfm_Ntk_t *, int, int, int)");
  }
  if (((int)uVar14 < 0) || ((p->vId2Var).nSize <= (int)uVar14)) goto LAB_0052a44d;
  iVar6 = (p->vId2Var).pArray[uVar14];
  if (iVar6 < 1) {
LAB_0052a46c:
    __assert_fail("Vec_IntEntry(&p->vId2Var, iObj) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmInt.h"
                  ,0xa7,"int Sfm_ObjSatVar(Sfm_Ntk_t *, int)");
  }
  Vec_IntPush(p->vDivIds,iVar6);
  iVar6 = clock_gettime(3,(timespec *)&ts);
  if (iVar6 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  wVar8 = Sfm_ComputeInterpolant(p);
  uTruth = wVar8;
  iVar6 = clock_gettime(3,(timespec *)&ts);
  if (iVar6 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  p->timeSat = p->timeSat + lVar11 + lVar10;
  if (wVar8 != 0x8765432187654321) {
    if (wVar8 == 0x1234567812345678) {
      p->nTimeOuts = p->nTimeOuts + 1;
      return 0;
    }
    if (p->pPars->fVeryVerbose == 0) goto LAB_0052a374;
    if ((p->vFanins).nSize <= iNode) goto LAB_00529fd7;
    pVVar2 = (p->vFanins).pArray;
    if ((f < pVVar2[uVar4].nSize) && ((int)uVar16 < p->vDivs->nSize)) {
      printf("Node %d: Fanin %d (%d) can be replaced by divisor %d (%d).   ",uVar4,uVar9,
             (ulong)(uint)pVVar2[uVar4].pArray[uVar13],uVar12 & 0xffffffff,
             (ulong)(uint)p->vDivs->pArray[uVar12 & 0xffffffff]);
LAB_0052a350:
      Kit_DsdPrintFromTruth((uint *)&uTruth,p->vDivIds->nSize);
      putchar(10);
      if (uVar16 == 0xffffffff) {
LAB_0052a398:
        p->nRemoves = p->nRemoves + 1;
        iVar6 = -1;
LAB_0052a3a4:
        Sfm_NtkUpdate(p,iNode,f,iVar6,uTruth);
        return 1;
      }
LAB_0052a374:
      p->nResubs = p->nResubs + 1;
      if ((int)uVar16 < p->vDivs->nSize) {
        iVar6 = p->vDivs->pArray[uVar16];
        goto LAB_0052a3a4;
      }
    }
    goto LAB_0052a44d;
  }
  iVar6 = p->nCexes;
  if (iVar6 == 0x40) {
    return 0;
  }
  iVar1 = p->vDivIds->nSize;
  if (iVar1 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
  }
  p->vDivIds->nSize = iVar1 + -1;
  goto LAB_0052a153;
}

Assistant:

int Sfm_NodeResubSolve( Sfm_Ntk_t * p, int iNode, int f, int fRemoveOnly )
{
    int fSkipUpdate  = 0;
    int fVeryVerbose = 0;//p->pPars->fVeryVerbose && Vec_IntSize(p->vDivs) < 200;// || pNode->Id == 556;
    int i, iFanin, iVar = -1;
    int iFaninRem = -1, iFaninSkip = -1;
    word uTruth, uSign, uMask;
    abctime clk;
    assert( Sfm_ObjIsNode(p, iNode) );
    assert( f >= 0 && f < Sfm_ObjFaninNum(p, iNode) );
    p->nTryRemoves++;
    // report init stats
    if ( p->pPars->fVeryVerbose )
        printf( "%5d : Lev =%3d. Leaf =%3d.  Node =%3d.  Div=%3d.  Fanin =%4d (%d/%d). MFFC = %d\n", 
            iNode, Sfm_ObjLevel(p, iNode), 0, Vec_IntSize(p->vNodes), Vec_IntSize(p->vDivs), 
            Sfm_ObjFanin(p, iNode, f), f, Sfm_ObjFaninNum(p, iNode), Sfm_ObjMffcSize(p, Sfm_ObjFanin(p, iNode, f)) );
    // clean simulation info
    p->nCexes = 0;
    Vec_WrdFill( p->vDivCexes, Vec_IntSize(p->vDivs), 0 );
    // try removing the critical fanin
    Vec_IntClear( p->vDivIds );
    Sfm_ObjForEachFanin( p, iNode, iFanin, i )
        if ( i != f )
            Vec_IntPush( p->vDivIds, Sfm_ObjSatVar(p, iFanin) );
        else
            iFaninRem = iFanin;
    assert( iFaninRem != -1 );
    // find fanin to skip 
    if ( Sfm_ObjIsFixed(p, iFaninRem) && Sfm_ObjFaninNum(p, iFaninRem) == 1 )
        iFaninSkip = Sfm_ObjFanin(p, iFaninRem, 0);
clk = Abc_Clock();
    uTruth = Sfm_ComputeInterpolant( p );
p->timeSat += Abc_Clock() - clk;
    // analyze outcomes
    if ( uTruth == SFM_SAT_UNDEC )
    {
        p->nTimeOuts++;
        return 0;
    }
    if ( uTruth != SFM_SAT_SAT )
        goto finish;
    if ( fRemoveOnly || p->pPars->fRrOnly || Vec_IntSize(p->vDivs) == 0 )
        return 0;

    p->nTryResubs++;
    if ( fVeryVerbose )
    {
        for ( i = 0; i < 9; i++ )
            printf( " " );
        for ( i = 0; i < Vec_IntSize(p->vDivs); i++ )
            printf( "%d", i % 10 );
        printf( "\n" );
    }
    while ( 1 ) 
    {
        if ( fVeryVerbose )
        {
            printf( "%3d: %3d ", p->nCexes, iVar );
            Vec_WrdForEachEntry( p->vDivCexes, uSign, i )
                printf( "%d", Abc_InfoHasBit((unsigned *)&uSign, p->nCexes-1) );
            printf( "\n" );
        }
        // find the next divisor to try
        uMask = (~(word)0) >> (64 - p->nCexes);
        Vec_WrdForEachEntry( p->vDivCexes, uSign, iVar )
            if ( uSign == uMask && Vec_IntEntry(p->vDivs, iVar) != iFaninSkip )
                break;
        if ( iVar == Vec_IntSize(p->vDivs) )
            return 0;
        assert( Vec_IntEntry(p->vDivs, iVar) != iFaninSkip );
        // try replacing the critical fanin
        Vec_IntPush( p->vDivIds, Sfm_ObjSatVar(p, Vec_IntEntry(p->vDivs, iVar)) );
clk = Abc_Clock();
        uTruth = Sfm_ComputeInterpolant( p );
p->timeSat += Abc_Clock() - clk;
        // analyze outcomes
        if ( uTruth == SFM_SAT_UNDEC )
        {
            p->nTimeOuts++;
            return 0;
        }
        if ( uTruth != SFM_SAT_SAT )
            goto finish;
        if ( p->nCexes == 64 )
            return 0;
        // remove the last variable
        Vec_IntPop( p->vDivIds );
    }
finish:
    if ( p->pPars->fVeryVerbose )
    {
        if ( iVar == -1 )
            printf( "Node %d: Fanin %d (%d) can be removed.  ", iNode, f, Sfm_ObjFanin(p, iNode, f) );
        else
            printf( "Node %d: Fanin %d (%d) can be replaced by divisor %d (%d).   ", 
            iNode, f, Sfm_ObjFanin(p, iNode, f), iVar, Vec_IntEntry(p->vDivs, iVar) );
        Kit_DsdPrintFromTruth( (unsigned *)&uTruth, Vec_IntSize(p->vDivIds) ); printf( "\n" );
    }
    if ( iVar == -1 )
        p->nRemoves++;
    else
        p->nResubs++;
    if ( fSkipUpdate )
        return 0;
    // update the network
    Sfm_NtkUpdate( p, iNode, f, (iVar == -1 ? iVar : Vec_IntEntry(p->vDivs, iVar)), uTruth );
    return 1;
 }